

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O1

void crnlib::crn_comp::append_vec(vector<unsigned_char> *a,vector<unsigned_char> *b)

{
  uint uVar1;
  uint uVar2;
  uint min_new_capacity;
  
  uVar1 = b->m_size;
  if (uVar1 != 0) {
    uVar2 = a->m_size;
    min_new_capacity = uVar2 + uVar1;
    if (!CARRY4(uVar2,uVar1)) {
      if (a->m_capacity < min_new_capacity) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)a,min_new_capacity,uVar1 == 1,1,(object_mover)0x0,false);
      }
      memset(a->m_p + a->m_size,0,(ulong)(min_new_capacity - a->m_size));
    }
    a->m_size = min_new_capacity;
    memcpy(a->m_p + uVar2,b->m_p,(ulong)b->m_size);
    return;
  }
  return;
}

Assistant:

inline uint size() const { return m_size; }